

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
* __thiscall
Graph::paths(vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
             *__return_storage_ptr__,Graph *this,Edge *start,Edge *stop)

{
  pointer ppVar1;
  pointer ppEVar2;
  Edge *this_00;
  Edge *pEVar3;
  bool bVar4;
  pointer ppEVar5;
  int iVar6;
  pointer ppEVar7;
  int iVar8;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> currPath;
  int local_78;
  Edge *pEStack_70;
  vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_> dfsStack;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> finishedPath;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  dfsStack.
  super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dfsStack.
  super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dfsStack.
  super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)start;
  std::vector<std::pair<int,Edge_const*>,std::allocator<std::pair<int,Edge_const*>>>::
  emplace_back<std::pair<int,Edge_const*>>
            ((vector<std::pair<int,Edge_const*>,std::allocator<std::pair<int,Edge_const*>>> *)
             &dfsStack,(pair<int,_const_Edge_*> *)&currPath);
  currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar8 = 0;
  do {
    while( true ) {
      if (dfsStack.
          super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          dfsStack.
          super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>::~_Vector_base
                  (&currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>);
        std::
        _Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>::
        ~_Vector_base(&dfsStack.
                       super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
                     );
        return __return_storage_ptr__;
      }
      ppVar1 = dfsStack.
               super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      pEStack_70 = dfsStack.
                   super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].second;
      dfsStack.
      super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           dfsStack.
           super__Vector_base<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_78 = (int)*(undefined8 *)ppVar1;
      for (iVar6 = iVar8; local_78 < iVar6; iVar6 = iVar6 + -1) {
        currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
      }
      if (iVar8 < local_78) {
        local_78 = iVar8;
      }
      iVar6 = -1;
      if (currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar6 = Edge::sharedVertex(pEStack_70,
                                   currPath.
                                   super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish[-1]);
      }
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::push_back(&currPath,&pEStack_70);
      iVar8 = local_78 + 1;
      if (pEStack_70 != stop) break;
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector(&finishedPath,&currPath);
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&finishedPath);
      std::_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>::~_Vector_base
                ((_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_> *)&finishedPath);
    }
    ppEVar2 = (pEStack_70->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppEVar7 = (pEStack_70->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar2;
        ppEVar7 = ppEVar7 + 1) {
      this_00 = *ppEVar7;
      bVar4 = Edge::connectsTo(this_00,iVar6);
      ppEVar5 = currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (!bVar4) {
        do {
          if (ppEVar5 ==
              currPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            finishedPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = iVar8;
            finishedPath.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)this_00;
            std::vector<std::pair<int,Edge_const*>,std::allocator<std::pair<int,Edge_const*>>>::
            emplace_back<std::pair<int,Edge_const*>>
                      ((vector<std::pair<int,Edge_const*>,std::allocator<std::pair<int,Edge_const*>>>
                        *)&dfsStack,(pair<int,_const_Edge_*> *)&finishedPath);
            break;
          }
          pEVar3 = *ppEVar5;
          ppEVar5 = ppEVar5 + 1;
        } while (pEVar3 != this_00);
      }
    }
  } while( true );
}

Assistant:

std::vector<std::vector<const Edge*>> Graph::paths(const Edge* start, const Edge* stop) {
  std::vector<std::vector<const Edge*>> paths;
  std::vector<std::pair<int, const Edge*>> dfsStack; //store depth at which edge has been found to know how often we need to backtrack
  dfsStack.push_back({0, start});
  std::vector<const Edge*> currPath;
  int dfsDepth = 0;
 
  while(dfsStack.size() > 0) {
    auto [curDepth, currEdge] = dfsStack.back();
    dfsStack.pop_back();
    while(dfsDepth > curDepth) {
      currPath.pop_back();
      dfsDepth--;
    }
    dfsDepth++;

    int sharedNode = -1;
    if(currPath.size() > 0) {
      const Edge* prev = currPath.back();
      sharedNode = currEdge->sharedVertex(prev);
      
    }
    currPath.push_back(currEdge);
    
    if(currEdge == stop) { //finnished path
      std::vector<const Edge*> finishedPath(currPath);
      paths.push_back(finishedPath);
      continue;
    }

    for(const Edge* neighbour: currEdge->neighbours) {
      bool onPath = false;

      //cant make sudden turns in a fork
      if(neighbour->connectsTo(sharedNode)) {
        continue;
      }
      
      for(const Edge* pathEdge: currPath) {
        if(pathEdge == neighbour) {
          onPath = true;
          break;
        }
      }
      if(onPath)
        continue;
      
      dfsStack.push_back({dfsDepth, neighbour});
    }
  }
  return paths;
}